

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbp.cpp
# Opt level: O3

void __thiscall merlin::lbp::run(lbp *this)

{
  indexed_heap *this_00;
  pointer puVar1;
  long lVar2;
  bool bVar3;
  undefined4 uVar4;
  Type TVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ostream *poVar9;
  factor *pfVar26;
  pointer pdVar10;
  double *pdVar11;
  ulong uVar12;
  undefined4 extraout_var;
  char *pcVar13;
  pointer pfVar14;
  index n;
  size_t n_00;
  pointer pdVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  pair<double,_unsigned_long> pVar25;
  factor logF;
  factor F_1;
  double local_148;
  long local_130;
  factor local_f0;
  factor local_90;
  
  (*(this->super_algorithm)._vptr_algorithm[2])();
  lVar7 = ((long)(this->super_factor_graph).super_graphical_model.m_factors.
                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->super_factor_graph).super_graphical_model.m_factors.
                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                 super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
  auVar22._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar22._0_8_ = lVar7;
  auVar22._12_4_ = 0x45300000;
  dVar24 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) *
           (this->super_algorithm).m_stop_iter;
  uVar8 = (ulong)dVar24;
  uVar8 = (long)(dVar24 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
  local_148 = (this->super_algorithm).m_stop_obj + 1.0;
  dVar24 = (this->super_algorithm).m_stop_msg + 1.0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[LBP] Begin message passing over factor graph ...",0x31);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  uVar4 = std::ostream::flush();
  auVar23._8_8_ = -(ulong)(dVar24 < (this->super_algorithm).m_stop_msg);
  auVar23._0_8_ = -(ulong)(local_148 < (this->super_algorithm).m_stop_obj);
  uVar4 = movmskpd(uVar4,auVar23);
  if ((((byte)uVar4 >> 1 | (byte)uVar4) & 1) == 0 && uVar8 != 0) {
    this_00 = &this->m_priority;
    lVar7 = 1;
    uVar12 = 0;
    local_130 = 0;
    while( true ) {
      TVar5 = (this->m_sched).t_;
      if (TVar5 == Priority) {
        pVar25 = indexed_heap::top(this_00);
        n = (this->super_factor_graph).super_graphical_model.super_graph.m_edges.
            super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
            super__Vector_impl_data._M_start[pVar25.second].second;
        indexed_heap::pop(this_00);
        TVar5 = (this->m_sched).t_;
      }
      else {
        puVar1 = (this->m_forder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        n = puVar1[local_130];
        local_130 = local_130 + 1;
        if (local_130 ==
            (long)(this->m_forder).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) {
          local_130 = 0;
        }
      }
      if (TVar5 != Flood) {
        factor::factor(&local_f0,
                       (this->super_factor_graph).super_graphical_model.m_factors.
                       super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                       super__Vector_impl_data._M_start + n);
        pdVar10 = local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pdVar15 = local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar15 != pdVar10; pdVar15 = pdVar15 + 1)
        {
          dVar18 = log(*pdVar15);
          *pdVar15 = dVar18;
        }
        pfVar26._0_4_ = (factor *)(*(this->super_algorithm)._vptr_algorithm[10])(this,n);
        factor::binaryOp<merlin::factor::binOpTimes>(&local_90,pfVar26._0_4_,&local_f0);
        dVar18 = 0.0;
        for (pdVar10 = local_90.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pdVar10 !=
            local_90.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish; pdVar10 = pdVar10 + 1) {
          dVar18 = dVar18 + *pdVar10;
        }
        dVar19 = obj_entropy(this,n);
        factor::~factor(&local_90);
        accept_incoming(this,n);
        pfVar26._0_4_ = (factor *)(*(this->super_algorithm)._vptr_algorithm[10])(this,n);
        factor::binaryOp<merlin::factor::binOpTimes>(&local_90,pfVar26._0_4_,&local_f0);
        dVar20 = 0.0;
        for (pdVar10 = local_90.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pdVar10 !=
            local_90.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish; pdVar10 = pdVar10 + 1) {
          dVar20 = dVar20 + *pdVar10;
        }
        dVar21 = obj_entropy(this,n);
        local_148 = dVar20 + dVar21 + (0.0 - (dVar18 + dVar19));
        this->m_logz = this->m_logz + local_148;
        factor::~factor(&local_90);
        factor::~factor(&local_f0);
      }
      update_outgoing(this,n);
      if ((this->m_sched).t_ == Priority) {
        pVar25 = indexed_heap::top(this_00);
        dVar24 = pVar25.first;
      }
      else if (((0.0 < (this->super_algorithm).m_stop_msg) && (local_130 == 0)) &&
              (dVar24 = 0.0,
              0x20 < (ulong)((long)(this->super_factor_graph).super_graphical_model.super_graph.
                                   m_edges.
                                   super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->super_factor_graph).super_graphical_model.super_graph.
                                  m_edges.
                                  super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>
                                  ._M_impl.super__Vector_impl_data._M_start))) {
        dVar24 = 0.0;
        lVar16 = 0;
        uVar17 = 0;
        do {
          dVar18 = factor::distance((factor *)
                                    ((long)&((this->m_msg_new).
                                             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                            _vptr_factor + lVar16),
                                    (factor *)
                                    ((long)&((this->m_msg).
                                             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                            _vptr_factor + lVar16),(Distance)(this->m_dist).t_);
          if (dVar18 <= dVar24) {
            dVar18 = dVar24;
          }
          dVar24 = dVar18;
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + 0x60;
        } while (uVar17 < ((long)(this->super_factor_graph).super_graphical_model.super_graph.
                                 m_edges.
                                 super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_factor_graph).super_graphical_model.super_graph.
                                 m_edges.
                                 super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5 &
                          0xfffffffffffffffeU));
      }
      dVar18 = this->m_logz;
      if (((this->m_sched).t_ == Flood) && (local_130 == 0)) {
        this->m_logz = 0.0;
        if ((this->super_factor_graph).super_graphical_model.m_factors.
            super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (this->super_factor_graph).super_graphical_model.m_factors.
            super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
            super__Vector_impl_data._M_start) {
          dVar19 = 0.0;
        }
        else {
          n_00 = 0;
          do {
            accept_incoming(this,n_00);
            pfVar26._0_4_ = (factor *)(*(this->super_algorithm)._vptr_algorithm[10])(this,n_00);
            factor::factor(&local_90,
                           (this->super_factor_graph).super_graphical_model.m_factors.
                           super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                           _M_impl.super__Vector_impl_data._M_start + n_00);
            pdVar10 = local_90.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            for (pdVar15 = local_90.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start; pdVar15 != pdVar10;
                pdVar15 = pdVar15 + 1) {
              dVar19 = log(*pdVar15);
              *pdVar15 = dVar19;
            }
            factor::binaryOp<merlin::factor::binOpTimes>(&local_f0,pfVar26._0_4_,&local_90);
            dVar19 = 0.0;
            for (pdVar11 = local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar11 !=
                local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar11 = pdVar11 + 1) {
              dVar19 = dVar19 + *pdVar11;
            }
            dVar20 = obj_entropy(this,n_00);
            this->m_logz = dVar19 + dVar20 + this->m_logz;
            factor::~factor(&local_f0);
            factor::~factor(&local_90);
            n_00 = n_00 + 1;
          } while (n_00 < (ulong)(((long)(this->super_factor_graph).super_graphical_model.m_factors.
                                         super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->super_factor_graph).super_graphical_model.m_factors.
                                         super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5) *
                                 -0x5555555555555555));
          dVar19 = this->m_logz;
        }
        local_148 = dVar18 - dVar19;
        dVar18 = dVar19;
      }
      bVar3 = (ulong)ABS(dVar18) < 0x7ff0000000000000;
      if (0x7fefffffffffffff < (ulong)ABS(dVar18)) break;
      if ((ulong)(lVar7 * -0x5555555555555555 *
                 ((long)(this->super_factor_graph).super_graphical_model.m_factors.
                        super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->super_factor_graph).super_graphical_model.m_factors.
                        super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5)) < uVar12) {
        lVar7 = lVar7 + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  logZ: ",8);
        lVar16 = std::cout;
        *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) &
             0xfffffefb | 4;
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar16 + -0x18)) = 0xc
        ;
        *(undefined8 *)(operator_delete__ + *(long *)(lVar16 + -0x18)) = 6;
        poVar9 = std::ostream::_M_insert<double>(this->m_logz);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," (",2);
        lVar16 = *(long *)poVar9;
        lVar2 = *(long *)(lVar16 + -0x18);
        *(uint *)(poVar9 + lVar2 + 0x18) = *(uint *)(poVar9 + lVar2 + 0x18) & 0xfffffefb | 0x100;
        *(undefined8 *)(poVar9 + *(long *)(lVar16 + -0x18) + 8) = 6;
        dVar18 = exp(this->m_logz);
        poVar9 = std::ostream::_M_insert<double>(dVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\td=",3);
        lVar16 = std::cout;
        *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) &
             0xfffffefb | 0x100;
        *(undefined8 *)(operator_delete__ + *(long *)(lVar16 + -0x18)) = 6;
        poVar9 = std::ostream::_M_insert<double>(local_148);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\tm=",3);
        poVar9 = std::ostream::_M_insert<double>(dVar24);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t time=",7);
        lVar16 = *(long *)poVar9;
        lVar2 = *(long *)(lVar16 + -0x18);
        *(uint *)(poVar9 + lVar2 + 0x18) = *(uint *)(poVar9 + lVar2 + 0x18) & 0xfffffefb | 4;
        *(undefined8 *)(poVar9 + *(long *)(lVar16 + -0x18) + 8) = 6;
        gettimeofday((timeval *)&local_f0,(__timezone_ptr_t)0x0);
        poVar9 = std::ostream::_M_insert<double>
                           (((double)(long)local_f0.v_.m_v.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start / 1000000.0 +
                            (double)(long)local_f0._vptr_factor) -
                            (this->super_algorithm).m_start_time);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\ti=",3);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      uVar12 = uVar12 + 1;
      if (((dVar24 < (this->super_algorithm).m_stop_msg) || (uVar8 <= uVar12)) ||
         (local_148 < (this->super_algorithm).m_stop_obj)) break;
    }
  }
  else {
    bVar3 = true;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[LBP] Converged after ",0x16);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," iterations in ",0xf);
  gettimeofday((timeval *)&local_f0,(__timezone_ptr_t)0x0);
  poVar9 = std::ostream::_M_insert<double>
                     (((double)(long)local_f0.v_.m_v.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start / 1000000.0 +
                      (double)(long)local_f0._vptr_factor) - (this->super_algorithm).m_start_time);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," seconds",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PR",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  lVar7 = std::cout;
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar7 + -0x18)) = 6;
  poVar9 = std::ostream::_M_insert<double>(this->m_logz);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," (",2);
  lVar7 = *(long *)poVar9;
  lVar16 = *(long *)(lVar7 + -0x18);
  *(uint *)(poVar9 + lVar16 + 0x18) = *(uint *)(poVar9 + lVar16 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar9 + *(long *)(lVar7 + -0x18) + 8) = 6;
  dVar24 = exp(this->m_logz);
  poVar9 = std::ostream::_M_insert<double>(dVar24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"STATUS",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  if (bVar3) {
    pcVar13 = "true: Consistent evidence";
    lVar7 = 0x19;
  }
  else {
    pcVar13 = "false: Inconsistent evidence or underflow";
    lVar7 = 0x29;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,lVar7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MAR",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  if ((this->super_factor_graph).m_vindex.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->super_factor_graph).m_vindex.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar8 = 0;
    do {
      dVar24 = (this->super_factor_graph).super_graphical_model.m_dims.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar8];
      uVar12 = (ulong)dVar24;
      uVar12 = (long)(dVar24 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      if (uVar12 != 0) {
        uVar17 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          lVar7 = std::cout;
          *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) &
               0xfffffefb | 4;
          *(undefined8 *)(operator_delete__ + *(long *)(lVar7 + -0x18)) = 6;
          iVar6 = (*(this->super_algorithm)._vptr_algorithm[0xb])(this,uVar8,uVar12);
          std::ostream::_M_insert<double>
                    (*(double *)(*(long *)(CONCAT44(extraout_var,iVar6) + 0x40) + uVar17 * 8));
          uVar17 = uVar17 + 1;
        } while (uVar12 != uVar17);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)(this->super_factor_graph).m_vindex.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->super_factor_graph).m_vindex.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  if (this->m_debug != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Final log partition function is ",0x20);
    poVar9 = std::ostream::_M_insert<double>(this->m_logz);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Final (normalized) beliefs\n",0x1b);
    pfVar14 = (this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
        _M_impl.super__Vector_impl_data._M_finish != pfVar14) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        poVar9 = operator<<((ostream *)&std::cout,(factor *)((long)&pfVar14->_vptr_factor + lVar7));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        uVar8 = uVar8 + 1;
        pfVar14 = (this->m_beliefs).
                  super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 0x60;
      } while (uVar8 < (ulong)(((long)(this->m_beliefs).
                                      super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar14 >>
                               5) * -0x5555555555555555));
    }
  }
  return;
}

Assistant:

void lbp::run() {

	init();

	// it's easier to count updates than "iterations"
	size_t stopIter = m_stop_iter * num_factors();

	bool ok = true;
	double dObj = m_stop_obj + 1.0, dMsg = m_stop_msg + 1.0;// initialize termination values
	size_t iter = 0, print = 1; // count updates and "iterations" for printing
	size_t f, n = 0;

	std::cout << "[LBP] Begin message passing over factor graph ..." << std::endl;
	for (; dMsg >= m_stop_msg && iter < stopIter && dObj >= m_stop_obj;) {

		if (m_sched == Schedule::Priority) { // priority schedule =>
			f = edge(m_priority.top().second).second; // get next factor for update from queue
			m_priority.pop();
		} else { // fixed schedule =>
			f = m_forder[n]; // get next factor from list
			if (++n == m_forder.size()) {
				n = 0; // loop over to the beginning of the fixed order
			}
		}

		if (m_sched != Schedule::Flood) {// For non-"flood" schedules,
			factor logF = log(get_factor(f));
			dObj = 0.0; // compute new belief and update objective:
			dObj -= (belief(f) * logF).sum() + obj_entropy(f); //   remove old contribution
			accept_incoming(f); //   accept all messages into factor f
			m_logz += dObj += (belief(f) * logF).sum() + obj_entropy(f); //   re-add new contribution
		}
		update_outgoing(f);		//   update outgoing messages from factor f

		if (m_sched == Schedule::Priority) {
			dMsg = m_priority.top().first; // priority schedule => easy to check msg stop
		} else if (m_stop_msg > 0 && n == 0) { // else check once each time through all factors
			dMsg = 0.0;
			for (size_t e = 0; e < 2 * num_edges(); ++e) {
				dMsg = std::max(dMsg, m_msg_new[e].distance(m_msg[e], m_dist));
			}
		}

		if (m_sched == Schedule::Flood && n == 0) { // for flooding schedules, recalculate all
			dObj = m_logz;
			m_logz = 0.0; //   the beliefs and objective now
			for (size_t f = 0; f < num_factors(); ++f) {
				accept_incoming(f);
				m_logz += (belief(f) * log(get_factor(f))).sum() + obj_entropy(f);
			}
			dObj -= m_logz;
		}

		// check if NaN or -inf
		if (isnan(m_logz) || isinf(m_logz)) {
			ok = false;
			break;
		}

		if (iter > print * num_factors()) {
			print++;
			std::cout << "  logZ: " << std::fixed << std::setw(12)
				<< std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ") ";
			std::cout << "\td=" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< dObj << "\tm=" << dMsg << "\t time="  << std::fixed
				<< std::setprecision(MERLIN_PRECISION)
				<< (timeSystem() - m_start_time)
				<< "\ti=" << iter << std::endl;
		}

		iter++;
	}

	// Output solution (UAI output format)
	std::cout << "[LBP] Converged after " << iter << " iterations in "
		<< (timeSystem() - m_start_time) << " seconds" << std::endl;
	std::cout << "PR" << std::endl;
	std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
		<< m_logz << " (" << std::scientific
		<< std::setprecision(MERLIN_PRECISION)
		<< std::exp(m_logz) << ")" << std::endl;
	if (!ok) {
		std::cout << "STATUS" << std::endl;
		std::cout << "false: Inconsistent evidence or underflow" << std::endl;
	} else {
		std::cout << "STATUS" << std::endl;
		std::cout << "true: Consistent evidence" << std::endl;
	}
	std::cout << "MAR" << std::endl;
	std::cout << nvar();
	for (size_t v = 0; v < m_vindex.size(); ++v) {
		variable VX = var(v);
		std::cout << " " << VX.states();
		for (size_t j = 0; j < VX.states(); ++j) {
			std::cout << " " << std::fixed
				<< std::setprecision(MERLIN_PRECISION) << belief(VX)[j];
		}
	}
	std::cout << std::endl;

	if (m_debug) {
		std::cout << "Final log partition function is " << m_logz << std::endl;
		std::cout << "Final (normalized) beliefs\n";
		for (size_t i = 0; i < m_beliefs.size(); ++i) {
			std::cout << m_beliefs[i] << std::endl;
		}
	}
}